

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

SquareMatrix<4> * __thiscall
pbrt::SquareMatrix<4>::operator+
          (SquareMatrix<4> *__return_storage_ptr__,SquareMatrix<4> *this,SquareMatrix<4> *m)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  
  uVar10 = *(undefined8 *)(this->m[0] + 2);
  uVar11 = *(undefined8 *)this->m[1];
  uVar12 = *(undefined8 *)(this->m[1] + 2);
  uVar13 = *(undefined8 *)this->m[2];
  uVar14 = *(undefined8 *)(this->m[2] + 2);
  uVar15 = *(undefined8 *)this->m[3];
  uVar16 = *(undefined8 *)(this->m[3] + 2);
  lVar17 = 0;
  *(undefined8 *)__return_storage_ptr__->m[0] = *(undefined8 *)this->m[0];
  *(undefined8 *)(__return_storage_ptr__->m[0] + 2) = uVar10;
  *(undefined8 *)__return_storage_ptr__->m[1] = uVar11;
  *(undefined8 *)(__return_storage_ptr__->m[1] + 2) = uVar12;
  *(undefined8 *)__return_storage_ptr__->m[2] = uVar13;
  *(undefined8 *)(__return_storage_ptr__->m[2] + 2) = uVar14;
  *(undefined8 *)__return_storage_ptr__->m[3] = uVar15;
  *(undefined8 *)(__return_storage_ptr__->m[3] + 2) = uVar16;
  do {
    pfVar1 = (float *)((long)m->m[0] + lVar17);
    fVar4 = pfVar1[1];
    fVar5 = pfVar1[2];
    fVar6 = pfVar1[3];
    pfVar2 = (float *)((long)__return_storage_ptr__->m[0] + lVar17);
    fVar7 = pfVar2[1];
    fVar8 = pfVar2[2];
    fVar9 = pfVar2[3];
    pfVar3 = (float *)((long)__return_storage_ptr__->m[0] + lVar17);
    *pfVar3 = *pfVar1 + *pfVar2;
    pfVar3[1] = fVar4 + fVar7;
    pfVar3[2] = fVar5 + fVar8;
    pfVar3[3] = fVar6 + fVar9;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

operator+(const SquareMatrix &m) const {
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] += m.m[i][j];
        return r;
    }